

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_util.cpp
# Opt level: O1

void spirv_cross_util::rename_interface_variable
               (Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
               uint32_t location,string *name)

{
  ID id;
  TypeID id_00;
  size_t sVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  Resource *pRVar5;
  string *name_00;
  Resource *pRVar6;
  uint32_t local_68;
  uint32_t local_64;
  string local_60;
  Resource *local_40;
  string *local_38;
  
  sVar1 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  if (sVar1 != 0) {
    pRVar6 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
    pRVar5 = pRVar6 + sVar1;
    name_00 = name;
    local_64 = location;
    local_40 = pRVar5;
    local_38 = name;
    do {
      bVar2 = spirv_cross::Compiler::has_decoration(compiler,(ID)(pRVar6->id).id,DecorationLocation)
      ;
      if ((bVar2) &&
         (uVar3 = spirv_cross::Compiler::get_decoration
                            (compiler,(ID)(pRVar6->id).id,DecorationLocation), uVar3 == local_64)) {
        pSVar4 = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar6->base_type_id).id);
        if (pSVar4->basetype == Struct) {
          id.id = (pRVar6->base_type_id).id;
          spirv_cross::join<char_const(&)[31],unsigned_int&>
                    (&local_60,(spirv_cross *)"SPIRV_Cross_Interface_Location",
                     (char (*) [31])&local_64,(uint *)name);
          spirv_cross::Compiler::set_name(compiler,id,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          local_68 = 0;
          pRVar5 = local_40;
          name_00 = local_38;
          if ((int)(pSVar4->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0)
          {
            do {
              uVar3 = local_68;
              id_00.id = (pRVar6->base_type_id).id;
              spirv_cross::join<char_const(&)[16],unsigned_int&>
                        (&local_60,(spirv_cross *)"InterfaceMember",(char (*) [16])&local_68,
                         (uint *)name);
              name = &local_60;
              spirv_cross::Compiler::set_member_name(compiler,id_00,uVar3,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
              }
              local_68 = local_68 + 1;
              pRVar5 = local_40;
              name_00 = local_38;
            } while (local_68 <
                     (uint)(pSVar4->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size);
          }
        }
        spirv_cross::Compiler::set_name(compiler,(ID)(pRVar6->id).id,name_00);
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar5);
  }
  return;
}

Assistant:

void rename_interface_variable(Compiler &compiler, const SmallVector<Resource> &resources, uint32_t location,
                               const std::string &name)
{
	for (auto &v : resources)
	{
		if (!compiler.has_decoration(v.id, spv::DecorationLocation))
			continue;

		auto loc = compiler.get_decoration(v.id, spv::DecorationLocation);
		if (loc != location)
			continue;

		auto &type = compiler.get_type(v.base_type_id);

		// This is more of a friendly variant. If we need to rename interface variables, we might have to rename
		// structs as well and make sure all the names match up.
		if (type.basetype == SPIRType::Struct)
		{
			compiler.set_name(v.base_type_id, join("SPIRV_Cross_Interface_Location", location));
			for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
				compiler.set_member_name(v.base_type_id, i, join("InterfaceMember", i));
		}

		compiler.set_name(v.id, name);
	}
}